

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O0

void __thiscall
crnlib::Resampler::Resampler
          (Resampler *this,int src_x,int src_y,int dst_x,int dst_y,Boundary_Op boundary_op,
          Resample_Real sample_low,Resample_Real sample_high,char *Pfilter_name,
          Contrib_List *Pclist_x,Contrib_List *Pclist_y,Resample_Real filter_x_scale,
          Resample_Real filter_y_scale,Resample_Real src_x_ofs,Resample_Real src_y_ofs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Sample *pSVar4;
  Contrib_List *pCVar5;
  int *piVar6;
  uchar *puVar7;
  Scan_Buf *pSVar8;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  Resampler *in_RDI;
  int in_R8D;
  Boundary_Op in_R9D;
  Resample_Real in_XMM0_Da;
  Resample_Real in_XMM1_Da;
  Resample_Real unaff_retaddr;
  Resample_Real unaff_retaddr_00;
  char *in_stack_00000008;
  undefined4 in_stack_00000010;
  Boundary_Op in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  int yx_ops;
  int xy_ops;
  int y_ops;
  int x_ops;
  _func_Resample_Real_Resample_Real *func;
  Resample_Real support;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  size_t in_stack_ffffffffffffff98;
  int local_3c;
  int local_38;
  Resampler *pRVar9;
  Resample_Real src_ofs;
  
  in_RDI->m_lo = in_XMM0_Da;
  in_RDI->m_hi = in_XMM1_Da;
  in_RDI->m_delay_x_resample = false;
  in_RDI->m_intermediate_x = 0;
  in_RDI->m_Pdst_buf = (Sample *)0x0;
  in_RDI->m_Ptmp_buf = (Sample *)0x0;
  in_RDI->m_clist_x_forced = false;
  in_RDI->m_Pclist_x = (Contrib_List *)0x0;
  in_RDI->m_clist_y_forced = false;
  in_RDI->m_Pclist_y = (Contrib_List *)0x0;
  in_RDI->m_Psrc_y_count = (int *)0x0;
  in_RDI->m_Psrc_y_flag = (uchar *)0x0;
  in_RDI->m_Pscan_buf = (Scan_Buf *)0x0;
  in_RDI->m_status = STATUS_OKAY;
  in_RDI->m_resample_src_x = in_ESI;
  in_RDI->m_resample_src_y = in_EDX;
  in_RDI->m_resample_dst_x = in_ECX;
  in_RDI->m_resample_dst_y = in_R8D;
  in_RDI->m_boundary_op = in_R9D;
  pRVar9 = in_RDI;
  pSVar4 = (Sample *)crnlib_malloc(0x1965fd);
  in_RDI->m_Pdst_buf = pSVar4;
  if (pSVar4 == (Sample *)0x0) {
    in_RDI->m_status = STATUS_OUT_OF_MEMORY;
  }
  else {
    if ((_func_Resample_Real_Resample_Real *)in_stack_00000008 ==
        (_func_Resample_Real_Resample_Real *)0x0) {
      in_stack_00000008 = "lanczos4";
    }
    for (local_38 = 0; src_ofs = (Resample_Real)((ulong)pRVar9 >> 0x20), local_38 < 0x10;
        local_38 = local_38 + 1) {
      iVar1 = strcmp(in_stack_00000008,&g_resample_filters + (long)local_38 * 0x30);
      src_ofs = (Resample_Real)((ulong)pRVar9 >> 0x20);
      if (iVar1 == 0) break;
    }
    if (local_38 == 0x10) {
      in_RDI->m_status = STATUS_BAD_FILTER_NAME;
    }
    else {
      if (CONCAT44(in_stack_00000014,in_stack_00000010) == 0) {
        pCVar5 = make_clist(in_stack_0000001c,in_stack_00000018,in_stack_00000014,
                            (_func_Resample_Real_Resample_Real *)in_stack_00000008,unaff_retaddr_00,
                            unaff_retaddr,src_ofs);
        in_RDI->m_Pclist_x = pCVar5;
        if (in_RDI->m_Pclist_x == (Contrib_List *)0x0) {
          in_RDI->m_status = STATUS_OUT_OF_MEMORY;
          return;
        }
      }
      else {
        in_RDI->m_Pclist_x = (Contrib_List *)CONCAT44(in_stack_00000014,in_stack_00000010);
        in_RDI->m_clist_x_forced = true;
      }
      if (CONCAT44(in_stack_0000001c,in_stack_00000018) == 0) {
        pCVar5 = make_clist(in_stack_0000001c,in_stack_00000018,in_stack_00000014,
                            (_func_Resample_Real_Resample_Real *)in_stack_00000008,unaff_retaddr_00,
                            unaff_retaddr,src_ofs);
        in_RDI->m_Pclist_y = pCVar5;
        if (in_RDI->m_Pclist_y == (Contrib_List *)0x0) {
          in_RDI->m_status = STATUS_OUT_OF_MEMORY;
          return;
        }
      }
      else {
        in_RDI->m_Pclist_y = (Contrib_List *)CONCAT44(in_stack_0000001c,in_stack_00000018);
        in_RDI->m_clist_y_forced = true;
      }
      piVar6 = (int *)crnlib_calloc((size_t)in_RDI,in_stack_ffffffffffffff98,
                                    (size_t *)
                                    CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      in_RDI->m_Psrc_y_count = piVar6;
      if (piVar6 == (int *)0x0) {
        in_RDI->m_status = STATUS_OUT_OF_MEMORY;
      }
      else {
        puVar7 = (uchar *)crnlib_calloc((size_t)in_RDI,in_stack_ffffffffffffff98,
                                        (size_t *)
                                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90
                                                ));
        in_RDI->m_Psrc_y_flag = puVar7;
        if (puVar7 == (uchar *)0x0) {
          in_RDI->m_status = STATUS_OUT_OF_MEMORY;
        }
        else {
          for (local_38 = 0; local_38 < in_RDI->m_resample_dst_y; local_38 = local_38 + 1) {
            for (local_3c = 0; local_3c < (int)(uint)in_RDI->m_Pclist_y[local_38].n;
                local_3c = local_3c + 1) {
              piVar6 = in_RDI->m_Psrc_y_count;
              iVar1 = resampler_range_check
                                ((uint)in_RDI->m_Pclist_y[local_38].p[local_3c].pixel,
                                 in_RDI->m_resample_src_y);
              piVar6[iVar1] = piVar6[iVar1] + 1;
            }
          }
          pSVar8 = (Scan_Buf *)crnlib_malloc(0x1968de);
          in_RDI->m_Pscan_buf = pSVar8;
          if (pSVar8 == (Scan_Buf *)0x0) {
            in_RDI->m_status = STATUS_OUT_OF_MEMORY;
          }
          else {
            for (local_38 = 0; local_38 < 0x4000; local_38 = local_38 + 1) {
              in_RDI->m_Pscan_buf->scan_buf_y[local_38] = -1;
              in_RDI->m_Pscan_buf->scan_buf_l[local_38] = (Sample *)0x0;
            }
            in_RDI->m_cur_dst_y = 0;
            in_RDI->m_cur_src_y = 0;
            iVar1 = count_ops(in_RDI,in_RDI->m_Pclist_x,in_RDI->m_resample_dst_x);
            iVar2 = count_ops(in_RDI,in_RDI->m_Pclist_y,in_RDI->m_resample_dst_y);
            iVar3 = iVar1 * in_RDI->m_resample_src_y + (iVar2 * 4 * in_RDI->m_resample_dst_x) / 3;
            iVar1 = (iVar2 * 4 * in_RDI->m_resample_src_x) / 3 + iVar1 * in_RDI->m_resample_dst_y;
            if ((iVar1 < iVar3) ||
               ((iVar3 == iVar1 && (in_RDI->m_resample_src_x < in_RDI->m_resample_dst_x)))) {
              in_RDI->m_delay_x_resample = true;
              in_RDI->m_intermediate_x = in_RDI->m_resample_src_x;
            }
            else {
              in_RDI->m_delay_x_resample = false;
              in_RDI->m_intermediate_x = in_RDI->m_resample_dst_x;
            }
            if ((in_RDI->m_delay_x_resample & 1U) != 0) {
              pSVar4 = (Sample *)crnlib_malloc(0x196a33);
              in_RDI->m_Ptmp_buf = pSVar4;
              if (pSVar4 == (Sample *)0x0) {
                in_RDI->m_status = STATUS_OUT_OF_MEMORY;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

Resampler::Resampler(int src_x, int src_y,
                     int dst_x, int dst_y,
                     Boundary_Op boundary_op,
                     Resample_Real sample_low, Resample_Real sample_high,
                     const char* Pfilter_name,
                     Contrib_List* Pclist_x,
                     Contrib_List* Pclist_y,
                     Resample_Real filter_x_scale,
                     Resample_Real filter_y_scale,
                     Resample_Real src_x_ofs,
                     Resample_Real src_y_ofs) {
  int i, j;
  Resample_Real support, (*func)(Resample_Real);

  resampler_assert(src_x > 0);
  resampler_assert(src_y > 0);
  resampler_assert(dst_x > 0);
  resampler_assert(dst_y > 0);

#if CRNLIB_RESAMPLER_DEBUG_OPS
  total_ops = 0;
#endif

  m_lo = sample_low;
  m_hi = sample_high;

  m_delay_x_resample = false;
  m_intermediate_x = 0;
  m_Pdst_buf = NULL;
  m_Ptmp_buf = NULL;
  m_clist_x_forced = false;
  m_Pclist_x = NULL;
  m_clist_y_forced = false;
  m_Pclist_y = NULL;
  m_Psrc_y_count = NULL;
  m_Psrc_y_flag = NULL;
  m_Pscan_buf = NULL;
  m_status = STATUS_OKAY;

  m_resample_src_x = src_x;
  m_resample_src_y = src_y;
  m_resample_dst_x = dst_x;
  m_resample_dst_y = dst_y;

  m_boundary_op = boundary_op;

  if ((m_Pdst_buf = (Sample*)crnlib_malloc(m_resample_dst_x * sizeof(Sample))) == NULL) {
    m_status = STATUS_OUT_OF_MEMORY;
    return;
  }

  // Find the specified filter.

  if (Pfilter_name == NULL)
    Pfilter_name = CRNLIB_RESAMPLER_DEFAULT_FILTER;

  for (i = 0; i < g_num_resample_filters; i++)
    if (strcmp(Pfilter_name, g_resample_filters[i].name) == 0)
      break;

  if (i == g_num_resample_filters) {
    m_status = STATUS_BAD_FILTER_NAME;
    return;
  }

  func = g_resample_filters[i].func;
  support = g_resample_filters[i].support;

  /* Create contributor lists, unless the user supplied custom lists. */

  if (!Pclist_x) {
    m_Pclist_x = make_clist(m_resample_src_x, m_resample_dst_x, m_boundary_op, func, support, filter_x_scale, src_x_ofs);
    if (!m_Pclist_x) {
      m_status = STATUS_OUT_OF_MEMORY;
      return;
    }
  } else {
    m_Pclist_x = Pclist_x;
    m_clist_x_forced = true;
  }

  if (!Pclist_y) {
    m_Pclist_y = make_clist(m_resample_src_y, m_resample_dst_y, m_boundary_op, func, support, filter_y_scale, src_y_ofs);
    if (!m_Pclist_y) {
      m_status = STATUS_OUT_OF_MEMORY;
      return;
    }
  } else {
    m_Pclist_y = Pclist_y;
    m_clist_y_forced = true;
  }

  if ((m_Psrc_y_count = (int*)crnlib_calloc(m_resample_src_y, sizeof(int))) == NULL) {
    m_status = STATUS_OUT_OF_MEMORY;
    return;
  }

  if ((m_Psrc_y_flag = (unsigned char*)crnlib_calloc(m_resample_src_y, sizeof(unsigned char))) == NULL) {
    m_status = STATUS_OUT_OF_MEMORY;
    return;
  }

  /* Count how many times each source line
      * contributes to a destination line.
      */

  for (i = 0; i < m_resample_dst_y; i++)
    for (j = 0; j < m_Pclist_y[i].n; j++)
      m_Psrc_y_count[resampler_range_check(m_Pclist_y[i].p[j].pixel, m_resample_src_y)]++;

  if ((m_Pscan_buf = (Scan_Buf*)crnlib_malloc(sizeof(Scan_Buf))) == NULL) {
    m_status = STATUS_OUT_OF_MEMORY;
    return;
  }

  for (i = 0; i < MAX_SCAN_BUF_SIZE; i++) {
    m_Pscan_buf->scan_buf_y[i] = -1;
    m_Pscan_buf->scan_buf_l[i] = NULL;
  }

  m_cur_src_y = m_cur_dst_y = 0;
  {
    // Determine which axis to resample first by comparing the number of multiplies required
    // for each possibility.
    int x_ops = count_ops(m_Pclist_x, m_resample_dst_x);
    int y_ops = count_ops(m_Pclist_y, m_resample_dst_y);

    // Hack 10/2000: Weight Y axis ops a little more than X axis ops.
    // (Y axis ops use more cache resources.)
    int xy_ops = x_ops * m_resample_src_y +
                 (4 * y_ops * m_resample_dst_x) / 3;

    int yx_ops = (4 * y_ops * m_resample_src_x) / 3 +
                 x_ops * m_resample_dst_y;

#if CRNLIB_RESAMPLER_DEBUG_OPS
    printf("src: %i %i\n", m_resample_src_x, m_resample_src_y);
    printf("dst: %i %i\n", m_resample_dst_x, m_resample_dst_y);
    printf("x_ops: %i\n", x_ops);
    printf("y_ops: %i\n", y_ops);
    printf("xy_ops: %i\n", xy_ops);
    printf("yx_ops: %i\n", yx_ops);
#endif

    // Now check which resample order is better. In case of a tie, choose the order
    // which buffers the least amount of data.
    if ((xy_ops > yx_ops) ||
        ((xy_ops == yx_ops) && (m_resample_src_x < m_resample_dst_x))) {
      m_delay_x_resample = true;
      m_intermediate_x = m_resample_src_x;
    } else {
      m_delay_x_resample = false;
      m_intermediate_x = m_resample_dst_x;
    }
#if CRNLIB_RESAMPLER_DEBUG_OPS
    printf("delaying: %i\n", m_delay_x_resample);
#endif
  }

  if (m_delay_x_resample) {
    if ((m_Ptmp_buf = (Sample*)crnlib_malloc(m_intermediate_x * sizeof(Sample))) == NULL) {
      m_status = STATUS_OUT_OF_MEMORY;
      return;
    }
  }
}